

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_internal.h
# Opt level: O0

ZSTD_sequenceLength ZSTD_getSequenceLength(seqStore_t *seqStore,seqDef *seq)

{
  ZSTD_sequenceLength ZVar1;
  seqDef *seq_local;
  seqStore_t *seqStore_local;
  ZSTD_sequenceLength seqLen;
  
  seqStore_local._0_4_ = (uint)seq->litLength;
  seqStore_local._4_4_ = seq->mlBase + 3;
  if (seqStore->longLengthPos == (U32)((long)seq - (long)seqStore->sequencesStart >> 3)) {
    if (seqStore->longLengthType == ZSTD_llt_literalLength) {
      seqStore_local._0_4_ = (uint)seqStore_local + 0x10000;
    }
    if (seqStore->longLengthType == ZSTD_llt_matchLength) {
      seqStore_local._4_4_ = seq->mlBase + 0x10003;
    }
  }
  ZVar1.matchLength = seqStore_local._4_4_;
  ZVar1.litLength = (uint)seqStore_local;
  return ZVar1;
}

Assistant:

MEM_STATIC ZSTD_sequenceLength ZSTD_getSequenceLength(seqStore_t const* seqStore, seqDef const* seq)
{
    ZSTD_sequenceLength seqLen;
    seqLen.litLength = seq->litLength;
    seqLen.matchLength = seq->mlBase + MINMATCH;
    if (seqStore->longLengthPos == (U32)(seq - seqStore->sequencesStart)) {
        if (seqStore->longLengthType == ZSTD_llt_literalLength) {
            seqLen.litLength += 0x10000;
        }
        if (seqStore->longLengthType == ZSTD_llt_matchLength) {
            seqLen.matchLength += 0x10000;
        }
    }
    return seqLen;
}